

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth_test.c
# Opt level: O0

REF_STATUS
ref_smooth_tet_two_fixture
          (REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,REF_INT *target_node,REF_INT *top_node)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT nodes [27];
  int local_44;
  REF_INT cell;
  REF_INT node;
  REF_NODE ref_node;
  REF_GRID_conflict ref_grid;
  REF_INT *top_node_local;
  REF_INT *target_node_local;
  REF_MPI ref_mpi_local;
  REF_GRID_conflict *ref_grid_ptr_local;
  
  ref_grid = (REF_GRID_conflict)top_node;
  top_node_local = target_node;
  target_node_local = &ref_mpi->n;
  ref_mpi_local = (REF_MPI)ref_grid_ptr;
  uVar1 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar1 == 0) {
    ref_node = *(REF_NODE *)ref_mpi_local;
    _cell = *(REF_NODE *)&ref_node->blank;
    uVar1 = ref_node_add(_cell,0,&local_44);
    if (uVar1 == 0) {
      _cell->real[local_44 * 0xf] = 0.0;
      _cell->real[local_44 * 0xf + 1] = 0.0;
      _cell->real[local_44 * 0xf + 2] = 0.0;
      ref_private_macro_code_rss_1 = local_44;
      uVar1 = ref_node_add(_cell,1,&local_44);
      if (uVar1 == 0) {
        _cell->real[local_44 * 0xf] = 1.0;
        _cell->real[local_44 * 0xf + 1] = 0.0;
        _cell->real[local_44 * 0xf + 2] = 0.0;
        ref_private_macro_code_rss = local_44;
        uVar1 = ref_node_add(_cell,2,&local_44);
        if (uVar1 == 0) {
          _cell->real[local_44 * 0xf] = 0.0;
          _cell->real[local_44 * 0xf + 1] = 1.0;
          _cell->real[local_44 * 0xf + 2] = 0.0;
          nodes[0] = local_44;
          uVar1 = ref_node_add(_cell,3,&local_44);
          if (uVar1 == 0) {
            _cell->real[local_44 * 0xf] = 1.0;
            _cell->real[local_44 * 0xf + 1] = 0.0;
            _cell->real[local_44 * 0xf + 2] = 1.0;
            nodes[1] = local_44;
            *top_node_local = local_44;
            uVar1 = ref_cell_add((REF_CELL)ref_node->ref_mpi,&ref_private_macro_code_rss_1,
                                 nodes + 0x1a);
            if (uVar1 == 0) {
              ref_private_macro_code_rss = nodes[0];
              uVar1 = ref_node_add(_cell,4,&local_44);
              if (uVar1 == 0) {
                _cell->real[local_44 * 0xf] = 0.0;
                _cell->real[local_44 * 0xf + 1] = 0.0;
                _cell->real[local_44 * 0xf + 2] = 1.0;
                nodes[0] = local_44;
                *(int *)&ref_grid->mpi = local_44;
                ref_grid_ptr_local._4_4_ =
                     ref_cell_add((REF_CELL)ref_node->ref_mpi,&ref_private_macro_code_rss_1,
                                  nodes + 0x1a);
                if (ref_grid_ptr_local._4_4_ == 0) {
                  ref_grid_ptr_local._4_4_ = 0;
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth_test.c"
                         ,0xde,"ref_smooth_tet_two_fixture",(ulong)ref_grid_ptr_local._4_4_,
                         "add tri");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth_test.c"
                       ,0xd6,"ref_smooth_tet_two_fixture",(ulong)uVar1,"add node");
                ref_grid_ptr_local._4_4_ = uVar1;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth_test.c"
                     ,0xd2,"ref_smooth_tet_two_fixture",(ulong)uVar1,"add tri");
              ref_grid_ptr_local._4_4_ = uVar1;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth_test.c"
                   ,0xca,"ref_smooth_tet_two_fixture",(ulong)uVar1,"add node");
            ref_grid_ptr_local._4_4_ = uVar1;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth_test.c"
                 ,0xc4,"ref_smooth_tet_two_fixture",(ulong)uVar1,"add node");
          ref_grid_ptr_local._4_4_ = uVar1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth_test.c"
               ,0xbe,"ref_smooth_tet_two_fixture",(ulong)uVar1,"add node");
        ref_grid_ptr_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth_test.c"
             ,0xb8,"ref_smooth_tet_two_fixture",(ulong)uVar1,"add node");
      ref_grid_ptr_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth_test.c",
           0xb2,"ref_smooth_tet_two_fixture",(ulong)uVar1,"grid");
    ref_grid_ptr_local._4_4_ = uVar1;
  }
  return ref_grid_ptr_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_smooth_tet_two_fixture(REF_GRID *ref_grid_ptr,
                                                     REF_MPI ref_mpi,
                                                     REF_INT *target_node,
                                                     REF_INT *top_node) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT node;
  REF_INT cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "grid");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  /* 0-1-2 base, 0-2-4 wall, 3 free */

  RSS(ref_node_add(ref_node, 0, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 0.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 0.0;
  nodes[0] = node;

  RSS(ref_node_add(ref_node, 1, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 1.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 0.0;
  nodes[1] = node;

  RSS(ref_node_add(ref_node, 2, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 0.0;
  ref_node_xyz(ref_node, 1, node) = 1.0;
  ref_node_xyz(ref_node, 2, node) = 0.0;
  nodes[2] = node;

  RSS(ref_node_add(ref_node, 3, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 1.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 1.0;
  nodes[3] = node;

  *target_node = node;

  RSS(ref_cell_add(ref_grid_tet(ref_grid), nodes, &cell), "add tri");

  nodes[1] = nodes[2];

  RSS(ref_node_add(ref_node, 4, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 0.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 1.0;
  nodes[2] = node;

  *top_node = node;

  RSS(ref_cell_add(ref_grid_tet(ref_grid), nodes, &cell), "add tri");

  return REF_SUCCESS;
}